

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_pointer_based_iterator.cpp
# Opt level: O2

void __thiscall
PointerBasedIterator_PostIncrement_Test::~PointerBasedIterator_PostIncrement_Test
          (PointerBasedIterator_PostIncrement_Test *this)

{
  testing::Test::~Test((Test *)this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST_F (PointerBasedIterator, PostIncrement) {
    std::array<int, 2> arr{{1, 3}};
    iterator i{&arr[0]};
    EXPECT_EQ (*i, 1);
    EXPECT_EQ (i++, iterator{&arr[0]});
    EXPECT_EQ (*i, 3);
    EXPECT_EQ (i++, iterator{&arr[1]});
    EXPECT_EQ (i, iterator{&arr[0] + 2});
}